

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChargeR.cpp
# Opt level: O2

void __thiscall OpenMD::ChargeR::writeChargeR(ChargeR *this)

{
  int iVar1;
  char cVar2;
  ostream *poVar3;
  uint uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ofstream rdfStream;
  
  std::ofstream::ofstream
            (&rdfStream,(this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    snprintf(painCave.errMsg,2000,"ChargeR: unable to open %s\n",
             (this->super_StaticAnalyser).outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar3 = std::operator<<((ostream *)&rdfStream,"#ChargeR ");
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<((ostream *)&rdfStream,"#selection: (");
    poVar3 = std::operator<<(poVar3,(string *)&this->selectionScript_);
    std::operator<<(poVar3,")\n");
    poVar3 = std::operator<<((ostream *)&rdfStream,"# r ");
    std::operator<<(poVar3,"\tcharge\n");
    for (uVar4 = 0; uVar5 = (ulong)uVar4,
        uVar5 < (ulong)((long)(this->chargeR_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->chargeR_).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
      dVar8 = this->deltaR_ * (double)uVar5;
      dVar6 = pow(this->deltaR_ + dVar8,3.0);
      dVar7 = pow(dVar8,3.0);
      dVar8 = (this->chargeR_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5];
      iVar1 = this->nProcessed_;
      poVar3 = std::ostream::_M_insert<double>(((double)uVar5 + 0.5) * this->deltaR_);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>
                         (dVar8 / ((((dVar6 - dVar7) * 12.566370614359172) / 3.0) * (double)iVar1));
      std::operator<<(poVar3,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&rdfStream);
  return;
}

Assistant:

void ChargeR::writeChargeR() {
    std::ofstream rdfStream(outputFilename_.c_str());
    if (rdfStream.is_open()) {
      rdfStream << "#ChargeR "
                << "\n";
      rdfStream << "#selection: (" << selectionScript_ << ")\n";
      rdfStream << "# r "
                << "\tcharge\n";
      RealType binCharge;
      for (unsigned int i = 0; i < chargeR_.size(); ++i) {
        RealType rLower = i * deltaR_;
        RealType rUpper = rLower + deltaR_;
        RealType volShell =
            (4.0 * Constants::PI) * (pow(rUpper, 3) - pow(rLower, 3)) / 3.0;

        RealType r = deltaR_ * (i + 0.5);

        binCharge = chargeR_[i] / (volShell * nProcessed_);

        rdfStream << r << "\t" << binCharge << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ChargeR: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    rdfStream.close();
  }